

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int value_for_key_as_uint64(MMDB_entry_s *start,char *key,uint64_t *value)

{
  int iVar1;
  char *path [2];
  MMDB_entry_data_s entry_data;
  char *local_48;
  undefined8 local_40;
  MMDB_entry_data_s local_38;
  
  local_48 = "build_epoch";
  local_40 = 0;
  iVar1 = MMDB_aget_value(start,&local_38,&local_48);
  if ((iVar1 == 0) && (iVar1 = 3, local_38.type == 9)) {
    *(char **)key = local_38.field_1.utf8_string;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
value_for_key_as_uint64(MMDB_entry_s *start, char *key, uint64_t *value) {
    MMDB_entry_data_s entry_data;
    const char *path[] = {key, NULL};
    int status = MMDB_aget_value(start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_UINT64 != entry_data.type) {
        DEBUG_MSGF("expect uint64 for %s but received %s",
                   key,
                   type_num_to_name(entry_data.type));
        return MMDB_INVALID_METADATA_ERROR;
    }
    *value = entry_data.uint64;
    return MMDB_SUCCESS;
}